

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Expr *p_local;
  WhereMaskSet *pMaskSet_local;
  
  if ((p->op == 0xa7) && ((p->flags & 0x20) == 0)) {
    pMaskSet_local = (WhereMaskSet *)sqlite3WhereGetMask(pMaskSet,p->iTable);
  }
  else if ((p->flags & 0x810000) == 0) {
    pMaskSet_local = (WhereMaskSet *)sqlite3WhereExprUsageFull(pMaskSet,p);
  }
  else {
    pMaskSet_local = (WhereMaskSet *)0x0;
  }
  return (Bitmask)pMaskSet_local;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  return sqlite3WhereExprUsageFull(pMaskSet, p);
}